

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O1

exr_attr_chlist_entry_t * __thiscall
Imf_3_4::Context::findChannel(Context *this,int partidx,char *name)

{
  bool bVar1;
  int iVar2;
  exr_attr_chlist_entry_t *peVar3;
  size_t sVar4;
  exr_attr_chlist_entry_t *peVar5;
  long lVar6;
  
  peVar3 = (exr_attr_chlist_entry_t *)channels(this,partidx);
  sVar4 = strlen(name);
  lVar6 = (long)(peVar3->name).length;
  if (0 < lVar6) {
    peVar5 = *(exr_attr_chlist_entry_t **)((long)&peVar3->name + 8);
    do {
      if (((peVar5->name).length == (int)sVar4) &&
         (iVar2 = bcmp(name,(exr_attr_chlist_entry_t *)(peVar5->name).str,(long)(int)sVar4),
         iVar2 == 0)) {
        bVar1 = false;
        peVar3 = peVar5;
      }
      else {
        bVar1 = true;
      }
      if (!bVar1) {
        return peVar3;
      }
      peVar5 = peVar5 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  return (exr_attr_chlist_entry_t *)0x0;
}

Assistant:

const exr_attr_chlist_entry_t* Context::findChannel (int partidx, const char* name) const
{
    const exr_attr_chlist_t* cl  = channels (partidx);
    int32_t                  len = strlen (name);

    for (int i = 0; i < cl->num_channels; ++i)
    {
        const exr_attr_chlist_entry_t* curc = cl->entries + i;
        if (curc->name.length == len && 0 == memcmp (name, curc->name.str, len))
        {
            return curc;
        }
    }
    return nullptr;
}